

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O3

int TvCtrlPointCallbackEventHandler(Upnp_EventType EventType,void *Event,void *Cookie)

{
  UpnpClient_Handle UVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  IXML_Document **sid;
  IXML_Document *pIVar6;
  undefined4 extraout_EDX;
  char *varName;
  char *varValue;
  UpnpActionComplete *a_event;
  char *pcVar7;
  undefined1 auVar8 [12];
  int TimeOut;
  Upnp_SID newSID;
  int local_5c;
  IXML_Document *local_58 [7];
  
  SampleUtil_PrintEvent(EventType,Event);
  UVar1 = ctrlpt_handle;
  switch(EventType) {
  case UPNP_CONTROL_ACTION_COMPLETE:
    uVar2 = UpnpActionComplete_get_ErrCode(Event);
    if (uVar2 == 0) {
      return 0;
    }
    pcVar7 = "Error in  Action Complete Callback -- %d\n";
    break;
  default:
    goto switchD_00104790_caseD_2;
  case UPNP_CONTROL_GET_VAR_COMPLETE:
    uVar2 = UpnpStateVarComplete_get_ErrCode(Event);
    if (uVar2 == 0) {
      uVar4 = UpnpStateVarComplete_get_CtrlUrl(Event);
      pcVar7 = (char *)UpnpString_get_String(uVar4);
      uVar4 = UpnpStateVarComplete_get_StateVarName(Event);
      varName = (char *)UpnpString_get_String(uVar4);
      varValue = (char *)UpnpStateVarComplete_get_CurrentVal(Event);
      TvCtrlPointHandleGetVar(pcVar7,varName,varValue);
      return 0;
    }
    pcVar7 = "Error in Get Var Complete Callback -- %d\n";
    break;
  case UPNP_DISCOVERY_ADVERTISEMENT_ALIVE:
  case UPNP_DISCOVERY_SEARCH_RESULT:
    local_58[0] = (IXML_Document *)0x0;
    uVar2 = UpnpDiscovery_get_ErrCode(Event);
    if (uVar2 != 0) {
      SampleUtil_Print("Error in Discovery Callback -- %d\n",(ulong)uVar2);
    }
    uVar4 = UpnpDiscovery_get_Location(Event);
    pcVar7 = (char *)UpnpString_get_String(uVar4);
    uVar2 = UpnpDownloadXmlDoc(pcVar7,local_58);
    pIVar6 = local_58[0];
    if (uVar2 == 0) {
      iVar3 = UpnpDiscovery_get_Expires(Event);
      TvCtrlPointAddDevice(pIVar6,pcVar7,iVar3);
    }
    else {
      SampleUtil_Print("Error obtaining device description from %s -- error = %d\n",pcVar7,
                       (ulong)uVar2);
    }
    if (local_58[0] != (IXML_Document *)0x0) {
      ixmlDocument_free();
    }
    goto LAB_001049b9;
  case UPNP_DISCOVERY_ADVERTISEMENT_BYEBYE:
    uVar2 = UpnpDiscovery_get_ErrCode(Event);
    uVar4 = UpnpDiscovery_get_DeviceID(Event);
    pcVar7 = (char *)UpnpString_get_String(uVar4);
    if (uVar2 != 0) {
      SampleUtil_Print("Error in Discovery ByeBye Callback -- %d\n",(ulong)uVar2);
    }
    SampleUtil_Print("Received ByeBye for Device: %s\n",pcVar7);
    TvCtrlPointRemoveDevice(pcVar7);
    SampleUtil_Print("After byebye:\n");
LAB_001049b9:
    TvCtrlPointPrintList();
    return 0;
  case UPNP_EVENT_RECEIVED:
    pcVar7 = (char *)UpnpEvent_get_SID_cstr(Event);
    iVar3 = UpnpEvent_get_EventKey(Event);
    pIVar6 = (IXML_Document *)UpnpEvent_get_ChangedVariables(Event);
    TvCtrlPointHandleEvent(pcVar7,iVar3,pIVar6);
    return 0;
  case UPNP_EVENT_RENEWAL_COMPLETE:
  case UPNP_EVENT_SUBSCRIBE_COMPLETE:
  case UPNP_EVENT_UNSUBSCRIBE_COMPLETE:
    uVar2 = UpnpEventSubscribe_get_ErrCode(Event);
    if (uVar2 == 0) {
      uVar4 = UpnpEventSubscribe_get_PublisherUrl(Event);
      uVar4 = UpnpString_get_String(uVar4);
      uVar5 = UpnpEventSubscribe_get_SID(Event);
      sid = (IXML_Document **)UpnpString_get_String(uVar5);
      UpnpEventSubscribe_get_TimeOut(Event);
      auVar8._8_4_ = extraout_EDX;
      auVar8._0_8_ = uVar4;
LAB_00104989:
      TvCtrlPointHandleSubscribeUpdate(auVar8._0_8_,(char *)sid,auVar8._8_4_);
      return 0;
    }
    pcVar7 = "Error in Event Subscribe Callback -- %d\n";
    break;
  case UPNP_EVENT_AUTORENEWAL_FAILED:
  case UPNP_EVENT_SUBSCRIPTION_EXPIRED:
    local_5c = default_timeout;
    uVar4 = UpnpEventSubscribe_get_PublisherUrl(Event);
    uVar4 = UpnpString_get_String(uVar4);
    uVar2 = UpnpSubscribe(UVar1,uVar4,&local_5c,local_58);
    if (uVar2 == 0) {
      sid = local_58;
      SampleUtil_Print("Subscribed to EventURL with SID=%s\n",sid);
      uVar4 = UpnpEventSubscribe_get_PublisherUrl(Event);
      auVar8 = UpnpString_get_String(uVar4);
      goto LAB_00104989;
    }
    pcVar7 = "Error Subscribing to EventURL -- %d\n";
  }
  SampleUtil_Print(pcVar7,(ulong)uVar2);
switchD_00104790_caseD_2:
  return 0;
}

Assistant:

int TvCtrlPointCallbackEventHandler(
	Upnp_EventType EventType, const void *Event, void *Cookie)
{
	int errCode = 0;
	(void)Cookie;

	SampleUtil_PrintEvent(EventType, Event);
	switch (EventType) {
	/* SSDP Stuff */
	case UPNP_DISCOVERY_ADVERTISEMENT_ALIVE:
	case UPNP_DISCOVERY_SEARCH_RESULT: {
		const UpnpDiscovery *d_event = (UpnpDiscovery *)Event;
		IXML_Document *DescDoc = NULL;
		const char *location = NULL;
		int errCode = UpnpDiscovery_get_ErrCode(d_event);

		if (errCode != UPNP_E_SUCCESS) {
			SampleUtil_Print(
				"Error in Discovery Callback -- %d\n", errCode);
		}

		location = UpnpString_get_String(
			UpnpDiscovery_get_Location(d_event));
		errCode = UpnpDownloadXmlDoc(location, &DescDoc);
		if (errCode != UPNP_E_SUCCESS) {
			SampleUtil_Print("Error obtaining device description "
					 "from %s -- error = %d\n",
				location,
				errCode);
		} else {
			TvCtrlPointAddDevice(DescDoc,
				location,
				UpnpDiscovery_get_Expires(d_event));
		}
		if (DescDoc) {
			ixmlDocument_free(DescDoc);
		}
		TvCtrlPointPrintList();
		break;
	}
	case UPNP_DISCOVERY_SEARCH_TIMEOUT:
		/* Nothing to do here... */
		break;
	case UPNP_DISCOVERY_ADVERTISEMENT_BYEBYE: {
		UpnpDiscovery *d_event = (UpnpDiscovery *)Event;
		int errCode = UpnpDiscovery_get_ErrCode(d_event);
		const char *deviceId = UpnpString_get_String(
			UpnpDiscovery_get_DeviceID(d_event));

		if (errCode != UPNP_E_SUCCESS) {
			SampleUtil_Print(
				"Error in Discovery ByeBye Callback -- %d\n",
				errCode);
		}
		SampleUtil_Print("Received ByeBye for Device: %s\n", deviceId);
		TvCtrlPointRemoveDevice(deviceId);
		SampleUtil_Print("After byebye:\n");
		TvCtrlPointPrintList();
		break;
	}
	/* SOAP Stuff */
	case UPNP_CONTROL_ACTION_COMPLETE: {
		UpnpActionComplete *a_event = (UpnpActionComplete *)Event;
		int errCode = UpnpActionComplete_get_ErrCode(a_event);
		if (errCode != UPNP_E_SUCCESS) {
			SampleUtil_Print(
				"Error in  Action Complete Callback -- %d\n",
				errCode);
		}
		/* No need for any processing here, just print out results.
		 * Service state table updates are handled by events. */
		break;
	}
	case UPNP_CONTROL_GET_VAR_COMPLETE: {
		UpnpStateVarComplete *sv_event = (UpnpStateVarComplete *)Event;
		int errCode = UpnpStateVarComplete_get_ErrCode(sv_event);
		if (errCode != UPNP_E_SUCCESS) {
			SampleUtil_Print(
				"Error in Get Var Complete Callback -- %d\n",
				errCode);
		} else {
			TvCtrlPointHandleGetVar(
				UpnpString_get_String(
					UpnpStateVarComplete_get_CtrlUrl(
						sv_event)),
				UpnpString_get_String(
					UpnpStateVarComplete_get_StateVarName(
						sv_event)),
				UpnpStateVarComplete_get_CurrentVal(sv_event));
		}
		break;
	}
	/* GENA Stuff */
	case UPNP_EVENT_RECEIVED: {
		UpnpEvent *e_event = (UpnpEvent *)Event;
		TvCtrlPointHandleEvent(UpnpEvent_get_SID_cstr(e_event),
			UpnpEvent_get_EventKey(e_event),
			UpnpEvent_get_ChangedVariables(e_event));
		break;
	}
	case UPNP_EVENT_SUBSCRIBE_COMPLETE:
	case UPNP_EVENT_UNSUBSCRIBE_COMPLETE:
	case UPNP_EVENT_RENEWAL_COMPLETE: {
		UpnpEventSubscribe *es_event = (UpnpEventSubscribe *)Event;

		errCode = UpnpEventSubscribe_get_ErrCode(es_event);
		if (errCode != UPNP_E_SUCCESS) {
			SampleUtil_Print(
				"Error in Event Subscribe Callback -- %d\n",
				errCode);
		} else {
			TvCtrlPointHandleSubscribeUpdate(
				UpnpString_get_String(
					UpnpEventSubscribe_get_PublisherUrl(
						es_event)),
				UpnpString_get_String(
					UpnpEventSubscribe_get_SID(es_event)),
				UpnpEventSubscribe_get_TimeOut(es_event));
		}
		break;
	}
	case UPNP_EVENT_AUTORENEWAL_FAILED:
	case UPNP_EVENT_SUBSCRIPTION_EXPIRED: {
		UpnpEventSubscribe *es_event = (UpnpEventSubscribe *)Event;
		int TimeOut = default_timeout;
		Upnp_SID newSID;

		errCode = UpnpSubscribe(ctrlpt_handle,
			UpnpString_get_String(
				UpnpEventSubscribe_get_PublisherUrl(es_event)),
			&TimeOut,
			newSID);
		if (errCode == UPNP_E_SUCCESS) {
			SampleUtil_Print(
				"Subscribed to EventURL with SID=%s\n", newSID);
			TvCtrlPointHandleSubscribeUpdate(
				UpnpString_get_String(
					UpnpEventSubscribe_get_PublisherUrl(
						es_event)),
				newSID,
				TimeOut);
		} else {
			SampleUtil_Print(
				"Error Subscribing to EventURL -- %d\n",
				errCode);
		}
		break;
	}
	/* ignore these cases, since this is not a device */
	case UPNP_EVENT_SUBSCRIPTION_REQUEST:
	case UPNP_CONTROL_GET_VAR_REQUEST:
	case UPNP_CONTROL_ACTION_REQUEST:
		break;
	}

	return 0;
}